

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  float fVar1;
  Float FVar2;
  LensElementInterface *pLVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  float fVar30;
  Float t;
  Float local_b4;
  float local_ac;
  Ray local_a8;
  Normal3f local_78;
  undefined1 local_68 [16];
  Ray *local_58;
  Image *local_50;
  undefined1 local_48 [16];
  
  auVar13._0_12_ = *(undefined1 (*) [12])&rCamera->o;
  auVar13._12_4_ = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar25._0_12_ = *(undefined1 (*) [12])&rCamera->d;
  auVar25._12_4_ = rCamera->time;
  local_a8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar13._0_8_;
  local_a8.o.super_Tuple3<pbrt::Point3,_float>.z = -(rCamera->o).super_Tuple3<pbrt::Point3,_float>.z
  ;
  local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z =
       -(rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_a8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar25._0_8_;
  local_a8.time = (Float)vextractps_avx(auVar25,3);
  local_a8.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  uVar9 = (this->elementInterfaces).nStored;
  uVar8 = (int)uVar9 - 1;
  local_58 = rOut;
  if ((int)uVar8 < 0) {
    local_b4 = 1.0;
  }
  else {
    auVar25 = vpshufd_avx(auVar13,0xe8);
    lVar12 = (ulong)uVar8 << 4;
    auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
    fVar30 = 0.0;
    uVar9 = (uVar9 & 0xffffffff) + 0xfffffffe;
    auVar13 = vpinsrd_avx(auVar25,auVar13._4_4_,1);
    auVar29 = ZEXT1664(auVar13);
    local_50 = &this->apertureImage;
    local_b4 = 1.0;
    lVar10 = (ulong)uVar8 + 1;
    do {
      auVar27 = auVar29._0_16_;
      pLVar3 = (this->elementInterfaces).ptr;
      fVar30 = fVar30 - *(float *)((long)&pLVar3->thickness + lVar12);
      local_78.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      local_78.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_78.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      fVar23 = *(float *)((long)&pLVar3->curvatureRadius + lVar12);
      if ((fVar23 != 0.0) || (NAN(fVar23))) {
        local_68._0_4_ = fVar23;
        bVar7 = IntersectSphericalElement(fVar23,fVar30 + fVar23,&local_a8,&local_ac,&local_78);
        auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
        if (!bVar7) {
          return 0.0;
        }
        auVar27._8_8_ = 0;
        auVar27._0_4_ = local_a8.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar27._4_4_ = local_a8.o.super_Tuple3<pbrt::Point3,_float>.y;
        fVar23 = (float)local_68._0_4_;
      }
      else {
        local_ac = (fVar30 - local_a8.o.super_Tuple3<pbrt::Point3,_float>.z) /
                   local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z;
        if (local_ac < 0.0) {
          return 0.0;
        }
      }
      fVar21 = local_a8.o.super_Tuple3<pbrt::Point3,_float>.z +
               local_ac * local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar4 = local_a8.d.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar5 = local_a8.d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar28._0_4_ = auVar27._0_4_ + local_ac * fVar4;
      auVar28._4_4_ = auVar27._4_4_ + local_ac * fVar5;
      auVar28._8_4_ = auVar27._8_4_ + local_ac * 0.0;
      auVar28._12_4_ = auVar27._12_4_ + local_ac * 0.0;
      auVar29 = ZEXT1664(auVar28);
      if ((((fVar23 != 0.0) || (NAN(fVar23))) ||
          ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1)) ||
         ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
        fVar1 = *(float *)((long)&pLVar3->apertureRadius + lVar12);
        auVar17._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar17._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar17._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar17._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar13 = vhaddps_avx(auVar17,auVar17);
        if (fVar1 * fVar1 < auVar13._0_4_) {
          return 0.0;
        }
        local_a8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar28);
        local_a8.o.super_Tuple3<pbrt::Point3,_float>.z = fVar21;
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          auVar25 = SUB6416(ZEXT464(0x3f800000),0);
          auVar13 = auVar25;
          if (lVar12 != 0) {
            fVar23 = (this->elementInterfaces).ptr[uVar9 & 0xffffffff].eta;
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              auVar13 = ZEXT416((uint)fVar23);
            }
          }
          fVar21 = auVar13._0_4_ / *(float *)((long)&pLVar3->eta + lVar12);
          auVar18._0_8_ = local_a8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar18._8_4_ = 0x80000000;
          auVar18._12_4_ = 0x80000000;
          auVar15._0_4_ = fVar4 * fVar4;
          auVar15._4_4_ = fVar5 * fVar5;
          auVar15._8_8_ = 0;
          auVar22._0_4_ = -local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar22._4_4_ = 0x80000000;
          auVar22._8_4_ = 0x80000000;
          auVar22._12_4_ = 0x80000000;
          auVar13 = vhaddps_avx(auVar15,auVar15);
          auVar13 = ZEXT416((uint)(auVar13._0_4_ +
                                  local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z *
                                  local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar13 = vsqrtss_avx(auVar13,auVar13);
          fVar23 = auVar13._0_4_;
          auVar16._4_4_ = fVar23;
          auVar16._0_4_ = fVar23;
          auVar16._8_4_ = fVar23;
          auVar16._12_4_ = fVar23;
          auVar14._0_4_ = auVar22._0_4_ / fVar23;
          auVar14._4_12_ = auVar22._4_12_;
          auVar13 = vdivps_avx(auVar18,auVar16);
          auVar19._8_8_ = 0;
          auVar19._0_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.x;
          auVar19._4_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar27 = vmovshdup_avx(auVar19);
          auVar28 = vmovshdup_avx(auVar13);
          auVar27 = vfmadd213ss_fma(auVar27,auVar28,
                                    ZEXT416((uint)(local_78.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar14._0_4_)));
          auVar28 = vfmsub231ss_fma(ZEXT416((uint)(local_78.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar14._0_4_)),
                                    ZEXT416((uint)local_78.super_Tuple3<pbrt::Normal3,_float>.z),
                                    auVar14);
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ + auVar28._0_4_)),auVar19,auVar13);
          auVar25 = vfnmadd213ss_fma(auVar27,auVar27,auVar25);
          auVar25 = vmaxss_avx(auVar25,auVar26._0_16_);
          fVar23 = auVar25._0_4_ / (fVar21 * fVar21);
          if (1.0 <= fVar23) {
            return 0.0;
          }
          auVar24._4_4_ = fVar21;
          auVar24._0_4_ = fVar21;
          auVar24._8_4_ = fVar21;
          auVar24._12_4_ = fVar21;
          auVar13 = vdivps_avx(auVar13,auVar24);
          auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar23)),auVar26._0_16_);
          auVar25 = vsqrtss_avx(auVar25,auVar25);
          fVar23 = auVar27._0_4_ / fVar21 - auVar25._0_4_;
          auVar20._0_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.x * fVar23;
          auVar20._4_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.y * fVar23;
          auVar20._8_4_ = fVar23 * 0.0;
          auVar20._12_4_ = fVar23 * 0.0;
          local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_78.super_Tuple3<pbrt::Normal3,_float>.z * fVar23 - auVar14._0_4_ / fVar21;
          auVar13 = vsubps_avx(auVar20,auVar13);
          local_a8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar13);
        }
      }
      else {
        fVar23 = *(float *)((long)&pLVar3->apertureRadius + lVar12);
        auVar13 = vmovshdup_avx(auVar28);
        local_68 = ZEXT416((uint)fVar21);
        auVar13 = vinsertps_avx(ZEXT416((uint)((auVar28._0_4_ / fVar23 + 1.0) * 0.5)),
                                ZEXT416((uint)(1.0 - (auVar13._0_4_ / fVar23 + 1.0) * 0.5)),0x10);
        local_48 = auVar28;
        local_b4 = Image::BilerpChannel(local_50,(Point2f)auVar13._0_8_,0,(WrapMode2D)0x100000001);
        auVar29 = ZEXT1664(local_48);
        auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
        if ((local_b4 == 0.0) && (!NAN(local_b4))) {
          return 0.0;
        }
        local_a8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_48);
        local_a8.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_68._0_4_;
      }
      uVar9 = uVar9 - 1;
      lVar12 = lVar12 + -0x10;
      lVar11 = lVar10 + -1;
      bVar7 = 0 < lVar10;
      lVar10 = lVar11;
    } while (lVar11 != 0 && bVar7);
  }
  if (local_58 != (Ray *)0x0) {
    auVar6._8_4_ = local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_4_ = local_a8.d.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar6._4_4_ = local_a8.d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar6._12_4_ = local_a8.time;
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.x =
         local_a8.o.super_Tuple3<pbrt::Point3,_float>.x;
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.y =
         local_a8.o.super_Tuple3<pbrt::Point3,_float>.y;
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.z =
         -local_a8.o.super_Tuple3<pbrt::Point3,_float>.z;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_a8.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_a8.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_a8.d.super_Tuple3<pbrt::Vector3,_float>.z;
    FVar2 = (Float)vextractps_avx(auVar6,3);
    local_58->time = FVar2;
    (local_58->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return local_b4;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = Sqr(pHit.x) + Sqr(pHit.y);
            if (r2 > Sqr(element.apertureRadius))
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}